

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,Path *value)

{
  bool bVar1;
  string str;
  string local_110;
  Path local_f0;
  
  if (value == (Path *)0x0) {
    bVar1 = false;
  }
  else {
    local_110._M_string_length = 0;
    local_110.field_2._M_local_buf[0] = '\0';
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    bVar1 = ReadPathIdentifier(this,&local_110);
    if (bVar1) {
      pathutil::FromString(&local_f0,&local_110);
      Path::operator=(value,&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._element._M_dataplus._M_p != &local_f0._element.field_2) {
        operator_delete(local_f0._element._M_dataplus._M_p,
                        local_f0._element.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._variant_part_str._M_dataplus._M_p != &local_f0._variant_part_str.field_2) {
        operator_delete(local_f0._variant_part_str._M_dataplus._M_p,
                        local_f0._variant_part_str.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._variant_selection_part._M_dataplus._M_p !=
          &local_f0._variant_selection_part.field_2) {
        operator_delete(local_f0._variant_selection_part._M_dataplus._M_p,
                        local_f0._variant_selection_part.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._variant_part._M_dataplus._M_p != &local_f0._variant_part.field_2) {
        operator_delete(local_f0._variant_part._M_dataplus._M_p,
                        local_f0._variant_part.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._prop_part._M_dataplus._M_p != &local_f0._prop_part.field_2) {
        operator_delete(local_f0._prop_part._M_dataplus._M_p,
                        local_f0._prop_part.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._prim_part._M_dataplus._M_p != &local_f0._prim_part.field_2) {
        operator_delete(local_f0._prim_part._M_dataplus._M_p,
                        local_f0._prim_part.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,
                      CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                               local_110.field_2._M_local_buf[0]) + 1);
    }
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(Path *value) {
  if (value) {
    std::string str;
    if (!ReadPathIdentifier(&str)) {
      return false;
    }

    (*value) = pathutil::FromString(str);

    return true;
  } else {
    return false;
  }
}